

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set_Record_R_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Set_Record_R_PDU::~Set_Record_R_PDU(Set_Record_R_PDU *this)

{
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Set_Record_R_PDU_00335ce8;
  (this->super_Reliability_Header)._vptr_Reliability_Header =
       (_func_int **)&PTR__Set_Record_R_PDU_00335d28;
  std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::clear
            (&this->m_vRecs);
  std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::~vector
            (&this->m_vRecs);
  Reliability_Header::~Reliability_Header(&this->super_Reliability_Header);
  Simulation_Management_Header::~Simulation_Management_Header
            (&this->super_Simulation_Management_Header);
  return;
}

Assistant:

Set_Record_R_PDU::~Set_Record_R_PDU()
{
    m_vRecs.clear();
}